

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void rtreeCheckCount(RtreeCheck *pCheck,char *zTbl,i64 nExpect)

{
  int iVar1;
  sqlite3_stmt *pStmt;
  sqlite3_int64 sVar2;
  i64 nActual;
  sqlite3_stmt *pCount;
  i64 nExpect_local;
  char *zTbl_local;
  RtreeCheck *pCheck_local;
  
  if ((pCheck->rc == 0) &&
     (pStmt = rtreeCheckPrepare(pCheck,"SELECT count(*) FROM %Q.\'%q%s\'",pCheck->zDb,pCheck->zTab,
                                zTbl), pStmt != (sqlite3_stmt *)0x0)) {
    iVar1 = sqlite3_step(pStmt);
    if ((iVar1 == 100) && (sVar2 = sqlite3_column_int64(pStmt,0), sVar2 != nExpect)) {
      rtreeCheckAppendMsg(pCheck,
                          "Wrong number of entries in %%%s table - expected %lld, actual %lld",zTbl,
                          nExpect,sVar2);
    }
    iVar1 = sqlite3_finalize(pStmt);
    pCheck->rc = iVar1;
  }
  return;
}

Assistant:

static void rtreeCheckCount(RtreeCheck *pCheck, const char *zTbl, i64 nExpect){
  if( pCheck->rc==SQLITE_OK ){
    sqlite3_stmt *pCount;
    pCount = rtreeCheckPrepare(pCheck, "SELECT count(*) FROM %Q.'%q%s'",
        pCheck->zDb, pCheck->zTab, zTbl
    );
    if( pCount ){
      if( sqlite3_step(pCount)==SQLITE_ROW ){
        i64 nActual = sqlite3_column_int64(pCount, 0);
        if( nActual!=nExpect ){
          rtreeCheckAppendMsg(pCheck, "Wrong number of entries in %%%s table"
              " - expected %lld, actual %lld" , zTbl, nExpect, nActual
          );
        }
      }
      pCheck->rc = sqlite3_finalize(pCount);
    }
  }
}